

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_handler.cpp
# Opt level: O3

spv_result_t spvtools::anon_unknown_6::getWord(spv_text text,spv_position position,string *word)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  spv_result_t sVar4;
  ulong uVar5;
  ulong uVar6;
  byte bVar7;
  byte bVar8;
  
  pcVar1 = text->str;
  sVar4 = SPV_ERROR_INVALID_TEXT;
  if ((pcVar1 != (char *)0x0) && (uVar2 = text->length, uVar2 != 0)) {
    if (position == (spv_position)0x0) {
      sVar4 = SPV_ERROR_INVALID_POINTER;
    }
    else {
      uVar3 = position->index;
      if (uVar3 < uVar2) {
        bVar8 = 0;
        bVar7 = 0;
        uVar6 = uVar3;
        do {
          uVar5 = (ulong)(byte)pcVar1[uVar6];
          if (uVar5 < 0x3c) {
            if ((0x800000100002600U >> (uVar5 & 0x3f) & 1) == 0) {
              if (uVar5 != 0x22) {
                if (uVar5 != 0) goto LAB_001996d5;
                break;
              }
              bVar7 = bVar7 ^ bVar8 ^ 1;
            }
            else if (!(bool)(bVar8 | bVar7)) break;
LAB_001996ac:
            bVar8 = 0;
          }
          else {
LAB_001996d5:
            if (pcVar1[uVar6] != 0x5c) goto LAB_001996ac;
            bVar8 = bVar8 ^ 1;
          }
          position->column = position->column + 1;
          uVar6 = uVar6 + 1;
          position->index = uVar6;
        } while (uVar2 != uVar6);
      }
      sVar4 = SPV_SUCCESS;
      std::__cxx11::string::replace
                ((ulong)word,0,(char *)word->_M_string_length,(ulong)(pcVar1 + uVar3));
    }
  }
  return sVar4;
}

Assistant:

spv_result_t getWord(spv_text text, spv_position position, std::string* word) {
  if (!text->str || !text->length) return SPV_ERROR_INVALID_TEXT;
  if (!position) return SPV_ERROR_INVALID_POINTER;

  const size_t start_index = position->index;

  bool quoting = false;
  bool escaping = false;

  // NOTE: Assumes first character is not white space!
  while (true) {
    if (position->index >= text->length) {
      word->assign(text->str + start_index, text->str + position->index);
      return SPV_SUCCESS;
    }
    const char ch = text->str[position->index];
    if (ch == '\\') {
      escaping = !escaping;
    } else {
      switch (ch) {
        case '"':
          if (!escaping) quoting = !quoting;
          break;
        case ' ':
        case ';':
        case '\t':
        case '\n':
        case '\r':
          if (escaping || quoting) break;
          word->assign(text->str + start_index, text->str + position->index);
          return SPV_SUCCESS;
        case '\0': {  // NOTE: End of word found!
          word->assign(text->str + start_index, text->str + position->index);
          return SPV_SUCCESS;
        }
        default:
          break;
      }
      escaping = false;
    }

    position->column++;
    position->index++;
  }
}